

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandReach(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  Abc_Ntk_t *pNtk_00;
  char *pcVar3;
  char *local_80;
  char *local_70;
  char *pLogFileName;
  int c;
  Abc_Ntk_t *pNtk;
  Saig_ParBbr_t *pPars;
  Saig_ParBbr_t Pars;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  Pars._32_8_ = argv;
  pNtk_00 = Abc_FrameReadNtk(pAbc);
  local_70 = (char *)0x0;
  Bbr_ManSetDefaultParams((Saig_ParBbr_t *)&pPars);
  Extra_UtilGetoptReset();
LAB_002349c3:
  do {
    iVar1 = Extra_UtilGetopt(argc,(char **)Pars._32_8_,"TBFLproyvh");
    if (iVar1 == -1) {
      if (pNtk_00 == (Abc_Ntk_t *)0x0) {
        Abc_Print(-1,"Empty network.\n");
        return 1;
      }
      iVar1 = Abc_NtkLatchNum(pNtk_00);
      if (iVar1 == 0) {
        Abc_Print(-1,"The current network has no latches.\n");
        return 0;
      }
      iVar1 = Abc_NtkIsStrash(pNtk_00);
      if (iVar1 == 0) {
        Abc_Print(-1,"Reachability analysis works only for AIGs (run \"strash\").\n");
        return 1;
      }
      iVar1 = Abc_NtkDarReach(pNtk_00,(Saig_ParBbr_t *)&pPars);
      pAbc->Status = iVar1;
      pAbc->nFrames = Pars.fSilent;
      Abc_FrameReplaceCex(pAbc,&pNtk_00->pSeqModel);
      if (local_70 != (char *)0x0) {
        Abc_NtkWriteLogFile(local_70,pAbc->pCex,pAbc->Status,pAbc->nFrames,"reach");
      }
      return 0;
    }
    switch(iVar1) {
    case 0x42:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-B\" should be followed by an integer.\n");
        goto LAB_00234d03;
      }
      pPars._4_4_ = atoi(*(char **)(Pars._32_8_ + (long)globalUtilOptind * 8));
      uVar2 = pPars._4_4_;
      break;
    default:
      goto LAB_00234d03;
    case 0x46:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-F\" should be followed by an integer.\n");
        goto LAB_00234d03;
      }
      Pars.TimeLimit = atoi(*(char **)(Pars._32_8_ + (long)globalUtilOptind * 8));
      uVar2 = Pars.TimeLimit;
      break;
    case 0x4c:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-L\" should be followed by a file name.\n");
        goto LAB_00234d03;
      }
      local_70 = *(char **)(Pars._32_8_ + (long)globalUtilOptind * 8);
      globalUtilOptind = globalUtilOptind + 1;
      goto LAB_002349c3;
    case 0x54:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-T\" should be followed by an integer.\n");
        goto LAB_00234d03;
      }
      pPars._0_4_ = atoi(*(char **)(Pars._32_8_ + (long)globalUtilOptind * 8));
      uVar2 = (uint)pPars;
      break;
    case 0x68:
      goto LAB_00234d03;
    case 0x6f:
      Pars.fPartition = Pars.fPartition ^ 1;
      goto LAB_002349c3;
    case 0x70:
      Pars.nBddMax = Pars.nBddMax ^ 1;
      goto LAB_002349c3;
    case 0x72:
      Pars.nIterMax = Pars.nIterMax ^ 1;
      goto LAB_002349c3;
    case 0x76:
      Pars.fReorder = Pars.fReorder ^ 1;
      goto LAB_002349c3;
    case 0x79:
      Pars.fVerbose = Pars.fVerbose ^ 1;
      goto LAB_002349c3;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if ((int)uVar2 < 0) {
LAB_00234d03:
      Abc_Print(-2,"usage: reach [-TBF num] [-L file] [-proyvh]\n");
      Abc_Print(-2,"\t         verifies sequential miter using BDD-based reachability\n");
      Abc_Print(-2,"\t-T num : approximate time limit in seconds (0=infinite) [default = %d]\n",
                (ulong)(uint)pPars);
      Abc_Print(-2,"\t-B num : max number of nodes in the intermediate BDDs [default = %d]\n",
                (ulong)pPars._4_4_);
      Abc_Print(-2,"\t-F num : max number of reachability iterations [default = %d]\n",
                (ulong)(uint)Pars.TimeLimit);
      if (local_70 == (char *)0x0) {
        local_80 = "no logging";
      }
      else {
        local_80 = local_70;
      }
      Abc_Print(-2,"\t-L file: the log file name [default = %s]\n",local_80);
      pcVar3 = "no";
      if (Pars.nBddMax != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-p     : enable partitioned image computation [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (Pars.nIterMax != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-r     : enable dynamic BDD variable reordering [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (Pars.fPartition != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,
                "\t-o     : toggles BDD variable reordering during image computation [default = %s]\n"
                ,pcVar3);
      pcVar3 = "no";
      if (Pars.fVerbose != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-y     : skip checking property outputs [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (Pars.fReorder != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-v     : prints verbose information [default = %s]\n",pcVar3);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandReach( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Saig_ParBbr_t Pars, * pPars = &Pars;
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int c;
    char * pLogFileName = NULL;

    extern int Abc_NtkDarReach( Abc_Ntk_t * pNtk, Saig_ParBbr_t * pPars );

    // set defaults
    Bbr_ManSetDefaultParams( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "TBFLproyvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->TimeLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->TimeLimit < 0 )
                goto usage;
            break;
        case 'B':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-B\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBddMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBddMax < 0 )
                goto usage;
            break;
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nIterMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nIterMax < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by a file name.\n" );
                goto usage;
            }
            pLogFileName = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 'p':
            pPars->fPartition ^= 1;
            break;
        case 'r':
            pPars->fReorder ^= 1;
            break;
        case 'o':
            pPars->fReorderImage ^= 1;
            break;
        case 'y':
            pPars->fSkipOutCheck ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( Abc_NtkLatchNum(pNtk) == 0 )
    {
        Abc_Print( -1, "The current network has no latches.\n" );
        return 0;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "Reachability analysis works only for AIGs (run \"strash\").\n" );
        return 1;
    }
    pAbc->Status  = Abc_NtkDarReach( pNtk, pPars );
    pAbc->nFrames = pPars->iFrame;
    Abc_FrameReplaceCex( pAbc, &pNtk->pSeqModel );
    if ( pLogFileName )
        Abc_NtkWriteLogFile( pLogFileName, pAbc->pCex, pAbc->Status, pAbc->nFrames, "reach" );
    return 0;

usage:
    Abc_Print( -2, "usage: reach [-TBF num] [-L file] [-proyvh]\n" );
    Abc_Print( -2, "\t         verifies sequential miter using BDD-based reachability\n" );
    Abc_Print( -2, "\t-T num : approximate time limit in seconds (0=infinite) [default = %d]\n", pPars->TimeLimit );
    Abc_Print( -2, "\t-B num : max number of nodes in the intermediate BDDs [default = %d]\n", pPars->nBddMax );
    Abc_Print( -2, "\t-F num : max number of reachability iterations [default = %d]\n", pPars->nIterMax );
    Abc_Print( -2, "\t-L file: the log file name [default = %s]\n", pLogFileName ? pLogFileName : "no logging" );
    Abc_Print( -2, "\t-p     : enable partitioned image computation [default = %s]\n", pPars->fPartition? "yes": "no" );
    Abc_Print( -2, "\t-r     : enable dynamic BDD variable reordering [default = %s]\n", pPars->fReorder? "yes": "no" );
    Abc_Print( -2, "\t-o     : toggles BDD variable reordering during image computation [default = %s]\n", pPars->fReorderImage? "yes": "no" );
    Abc_Print( -2, "\t-y     : skip checking property outputs [default = %s]\n", pPars->fSkipOutCheck? "yes": "no" );
    Abc_Print( -2, "\t-v     : prints verbose information [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}